

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O1

Sfm_Lib_t * Sfm_LibStart(int nVars,int fDelay,int fVerbose)

{
  size_t __size;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Sfm_Lib_t *pSVar4;
  word *pEntry;
  Vec_Mem_t *p;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Sfm_Fun_t *pSVar7;
  int iVar8;
  uint uVar9;
  
  pSVar4 = (Sfm_Lib_t *)calloc(1,0xa0);
  if (8 < nVars) {
    __assert_fail("nVars <= SFM_SUPP_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                  ,0xcf,"Sfm_Lib_t *Sfm_LibStart(int, int, int)");
  }
  uVar1 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar1 = 1;
  }
  __size = (ulong)uVar1 * 8;
  pEntry = (word *)malloc(__size);
  p = (Vec_Mem_t *)calloc(1,0x30);
  p->nEntrySize = uVar1;
  p->LogPageSze = 0xc;
  p->PageMask = 0xfff;
  p->iPage = -1;
  if ((p->vTable != (Vec_Int_t *)0x0) || (p->vNexts != (Vec_Int_t *)0x0)) {
    __assert_fail("p->vTable == NULL && p->vNexts == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                  ,0x13b,"void Vec_MemHashAlloc(Vec_Mem_t *, int)");
  }
  uVar2 = 9999;
  while( true ) {
    do {
      uVar9 = uVar2;
      uVar2 = uVar9 + 1;
    } while ((uVar9 & 1) != 0);
    if (uVar2 < 9) break;
    iVar8 = 5;
    while (uVar2 % (iVar8 - 2U) != 0) {
      uVar3 = iVar8 * iVar8;
      iVar8 = iVar8 + 2;
      if (uVar2 < uVar3) goto LAB_004b7eb0;
    }
  }
LAB_004b7eb0:
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  uVar3 = 0x10;
  if (0xe < uVar9) {
    uVar3 = uVar2;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = uVar3;
  piVar6 = (int *)malloc((long)(int)uVar3 << 2);
  pVVar5->pArray = piVar6;
  pVVar5->nSize = uVar2;
  memset(piVar6,0xff,(long)(int)uVar2 << 2);
  p->vTable = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 10000;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(40000);
  pVVar5->pArray = piVar6;
  p->vNexts = pVVar5;
  memset(pEntry,0,__size);
  iVar8 = Vec_MemHashInsert(p,pEntry);
  if (iVar8 != 0) {
    __assert_fail("Value == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                  ,0x189,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
  }
  memset(pEntry,0xaa,__size);
  iVar8 = Vec_MemHashInsert(p,pEntry);
  if (iVar8 != 1) {
    __assert_fail("Value == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                  ,0x18e,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
  }
  if (pEntry != (word *)0x0) {
    free(pEntry);
  }
  pSVar4->vTtMem = p;
  if ((pSVar4->vLists).nCap < 0x10000) {
    piVar6 = (pSVar4->vLists).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc(0x40000);
    }
    else {
      piVar6 = (int *)realloc(piVar6,0x40000);
    }
    (pSVar4->vLists).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_004b823b;
    (pSVar4->vLists).nCap = 0x10000;
  }
  if ((pSVar4->vCounts).nCap < 0x10000) {
    piVar6 = (pSVar4->vCounts).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc(0x40000);
    }
    else {
      piVar6 = (int *)realloc(piVar6,0x40000);
    }
    (pSVar4->vCounts).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_004b823b;
    (pSVar4->vCounts).nCap = 0x10000;
  }
  if ((pSVar4->vHits).nCap < 0x10000) {
    piVar6 = (pSVar4->vHits).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc(0x40000);
    }
    else {
      piVar6 = (int *)realloc(piVar6,0x40000);
    }
    (pSVar4->vHits).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_004b823b;
    (pSVar4->vHits).nCap = 0x10000;
  }
  if ((pSVar4->vLists).nCap < 2) {
    piVar6 = (pSVar4->vLists).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc(8);
    }
    else {
      piVar6 = (int *)realloc(piVar6,8);
    }
    (pSVar4->vLists).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_004b823b;
    (pSVar4->vLists).nCap = 2;
  }
  piVar6 = (pSVar4->vLists).pArray;
  piVar6[0] = -1;
  piVar6[1] = -1;
  (pSVar4->vLists).nSize = 2;
  if ((pSVar4->vCounts).nCap < 2) {
    piVar6 = (pSVar4->vCounts).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc(8);
    }
    else {
      piVar6 = (int *)realloc(piVar6,8);
    }
    (pSVar4->vCounts).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_004b823b;
    (pSVar4->vCounts).nCap = 2;
  }
  piVar6 = (pSVar4->vCounts).pArray;
  piVar6[0] = -1;
  piVar6[1] = -1;
  (pSVar4->vCounts).nSize = 2;
  if ((pSVar4->vHits).nCap < 2) {
    piVar6 = (pSVar4->vHits).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc(8);
    }
    else {
      piVar6 = (int *)realloc(piVar6,8);
    }
    (pSVar4->vHits).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_004b823b;
    (pSVar4->vHits).nCap = 2;
  }
  piVar6 = (pSVar4->vHits).pArray;
  piVar6[0] = -1;
  piVar6[1] = -1;
  (pSVar4->vHits).nSize = 2;
  pSVar4->nObjsAlloc = 0x10000;
  pSVar7 = (Sfm_Fun_t *)calloc(0x10000,0x1c);
  pSVar4->pObjs = pSVar7;
  pSVar4->fDelay = fDelay;
  if (fDelay != 0) {
    if ((pSVar4->vProfs).nCap < 0x10000) {
      piVar6 = (pSVar4->vProfs).pArray;
      if (piVar6 == (int *)0x0) {
        piVar6 = (int *)malloc(0x40000);
      }
      else {
        piVar6 = (int *)realloc(piVar6,0x40000);
      }
      (pSVar4->vProfs).pArray = piVar6;
      if (piVar6 == (int *)0x0) goto LAB_004b823b;
      (pSVar4->vProfs).nCap = 0x10000;
    }
    if ((pSVar4->vStore).nCap < 0x40000) {
      piVar6 = (pSVar4->vStore).pArray;
      if (piVar6 == (int *)0x0) {
        piVar6 = (int *)malloc(0x100000);
      }
      else {
        piVar6 = (int *)realloc(piVar6,0x100000);
      }
      (pSVar4->vStore).pArray = piVar6;
      if (piVar6 == (int *)0x0) goto LAB_004b823b;
      (pSVar4->vStore).nCap = 0x40000;
    }
  }
  if ((pSVar4->vTemp).nCap < 0x10) {
    piVar6 = (pSVar4->vTemp).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc(0x40);
    }
    else {
      piVar6 = (int *)realloc(piVar6,0x40);
    }
    (pSVar4->vTemp).pArray = piVar6;
    if (piVar6 == (int *)0x0) {
LAB_004b823b:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pSVar4->vTemp).nCap = 0x10;
  }
  pSVar4->nVars = nVars;
  pSVar4->nWords = uVar1;
  pSVar4->fVerbose = fVerbose;
  return pSVar4;
}

Assistant:

Sfm_Lib_t * Sfm_LibStart( int nVars, int fDelay, int fVerbose )
{
    Sfm_Lib_t * p = ABC_CALLOC( Sfm_Lib_t, 1 );
    assert( nVars <= SFM_SUPP_MAX );
    p->vTtMem = Vec_MemAllocForTT( nVars, 0 );   
    Vec_IntGrow( &p->vLists,  (1 << 16) );
    Vec_IntGrow( &p->vCounts, (1 << 16) );
    Vec_IntGrow( &p->vHits,   (1 << 16) );
    Vec_IntFill( &p->vLists,  2, -1 );
    Vec_IntFill( &p->vCounts, 2, -1 );
    Vec_IntFill( &p->vHits,   2, -1 );
    p->nObjsAlloc = (1 << 16);
    p->pObjs = ABC_CALLOC( Sfm_Fun_t, p->nObjsAlloc );
    p->fDelay = fDelay;
    if ( fDelay ) Vec_IntGrow( &p->vProfs,  (1 << 16) );
    if ( fDelay ) Vec_IntGrow( &p->vStore,  (1 << 18) );
    Vec_IntGrow( &p->vTemp, 16 );
    p->nVars = nVars;
    p->nWords = Abc_TtWordNum( nVars );
    p->fVerbose = fVerbose;
    return p;
}